

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.h
# Opt level: O2

void __thiscall xLearn::Model::~Model(Model *this)

{
  free_model(this);
  std::__cxx11::string::~string((string *)&this->loss_func_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Model() { free_model(); }